

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNegativePartialUpdateTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::egl::anon_unknown_0::PassNullTest::iterate(PassNullTest *this)

{
  TestLog *log;
  deUint32 dVar1;
  EGLBoolean got;
  Library *egl;
  int bufferAge;
  CallLogWrapper wrapper;
  allocator<char> local_86;
  allocator<char> local_85;
  undefined4 local_84;
  ScopedLogSection local_80;
  CallLogWrapper local_78;
  string local_60;
  string local_40;
  
  egl = EglTestContext::getLibrary
                  ((this->super_NegativePartialUpdateTest).super_TestCase.m_eglTestCtx);
  log = ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.super_TestNode.
        m_testCtx)->m_log;
  eglu::CallLogWrapper::CallLogWrapper(&local_78,egl,log);
  local_84 = 0xffffffff;
  local_78.m_enableLog = true;
  tcu::TestContext::setTestResult
            ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Test6",&local_85);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"If pass (null, 0) to setDamageRegion(), no error",&local_86);
  tcu::ScopedLogSection::ScopedLogSection(&local_80,log,&local_40,&local_60);
  tcu::ScopedLogSection::~ScopedLogSection(&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (*egl->_vptr_Library[0x30])
            (egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,
             (this->super_NegativePartialUpdateTest).m_eglSurface,0x3093,0x3095);
  dVar1 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar1,
                   "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                   ,0x1db);
  (*egl->_vptr_Library[0x2b])
            (egl,(this->super_NegativePartialUpdateTest).m_eglDisplay,
             (this->super_NegativePartialUpdateTest).m_eglSurface,0x313d);
  dVar1 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar1,"querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &bufferAge)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                   ,0x1dc);
  got = eglu::CallLogWrapper::eglSetDamageRegionKHR
                  (&local_78,(this->super_NegativePartialUpdateTest).m_eglDisplay,
                   (this->super_NegativePartialUpdateTest).m_eglSurface,(EGLint *)0x0,0);
  NegativePartialUpdateTest::expectTrue(&this->super_NegativePartialUpdateTest,got);
  NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x3000);
  eglu::CallLogWrapper::~CallLogWrapper(&local_78);
  return STOP;
}

Assistant:

TestCase::IterateResult PassNullTest::iterate (void)
{
	const Library&			egl				= m_eglTestCtx.getLibrary();
	TestLog&				log				= m_testCtx.getLog();
	CallLogWrapper			wrapper			(egl, log);
	int						bufferAge		= -1;

	wrapper.enableLogging(true);
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	{
		tcu::ScopedLogSection(log, "Test6", "If pass (null, 0) to setDamageRegion(), no error");
		EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));
		EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &bufferAge));
		expectTrue(wrapper.eglSetDamageRegionKHR(m_eglDisplay, m_eglSurface, DE_NULL, 0));
		expectError(EGL_SUCCESS);
	}

	return STOP;
}